

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

Quaternion ConvexDecomposition::YawPitchRoll(float yaw,float pitch,float roll)

{
  undefined1 auVar1 [64];
  undefined1 auVar3 [64];
  float3 v;
  Quaternion QVar5;
  float4 fVar6;
  float4 local_50;
  Quaternion local_40;
  Quaternion local_30;
  Quaternion local_20;
  undefined1 auVar2 [56];
  undefined1 auVar4 [56];
  
  Quaternion::Quaternion(&local_20,(float3)(ZEXT412(0x3f800000) << 0x40),yaw * 0.017453292);
  v._0_8_ = SUB648(ZEXT464(0x3f800000),0);
  v.z = 0.0;
  auVar4 = ZEXT856(0);
  auVar2 = (undefined1  [56])0x0;
  Quaternion::Quaternion(&local_30,v,pitch * 0.017453292);
  QVar5 = operator*(&local_20,&local_30);
  auVar3._0_8_ = QVar5.super_float4._8_8_;
  auVar3._8_56_ = auVar4;
  auVar1._0_8_ = QVar5.super_float4._0_8_;
  auVar1._8_56_ = auVar2;
  local_50 = (float4)vmovlhps_avx(auVar1._0_16_,auVar3._0_16_);
  Quaternion::Quaternion(&local_40,(float3)ZEXT812(0x3f80000000000000),roll * 0.017453292);
  fVar6 = (float4)operator*((Quaternion *)&local_50,&local_40);
  return (Quaternion)fVar6;
}

Assistant:

Quaternion YawPitchRoll( float yaw, float pitch, float roll ) 
{
	roll  *= DEG2RAD;
	yaw   *= DEG2RAD;
	pitch *= DEG2RAD;
	return Quaternion(float3(0.0f,0.0f,1.0f),yaw)*Quaternion(float3(1.0f,0.0f,0.0f),pitch)*Quaternion(float3(0.0f,1.0f,0.0f),roll);
}